

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

wostream * Centaurus::operator<<(wostream *os,IndexVector *v)

{
  bool bVar1;
  wostream *pwVar2;
  pointer piVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  wchar_t local_2c [3];
  
  local_2c[1] = 0x5b;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_2c + 1,1);
  piVar4 = (v->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  piVar3 = (v->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((long)piVar4 - (long)piVar3 != 4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      pwVar2 = (wostream *)std::wostream::operator<<((wostream *)os,piVar3[uVar5]);
      local_2c[0] = L',';
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,local_2c,1);
      piVar4 = (v->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar3 = (v->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      bVar1 = uVar6 < ((long)piVar4 - (long)piVar3 >> 2) - 1U;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  if (piVar3 != piVar4) {
    std::wostream::operator<<((wostream *)os,piVar4[-1]);
  }
  local_2c[2] = 0x5d;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_2c + 2,1);
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const IndexVector& v)
{
    os << L'[';
    for (unsigned int i = 0; i < v.size() - 1; i++)
    {
        os << v[i] << L',';
    }
    if (!v.empty())
        os << v.back();
    os << L']';
    return os;
}